

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_r6_muldiv(DisasContext_conflict6 *ctx,int opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i32 c2;
  TCGv_i32 v1;
  TCGv_i32 ret;
  TCGv_i64 ret_00;
  
  if (rd == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,rs);
  gen_load_gpr(tcg_ctx,t_00,rt);
  switch(opc) {
  case 0x98:
  case 0x99:
    ret = tcg_temp_new_i32(tcg_ctx);
    c2 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,ret,t);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,c2,t_00);
    tcg_gen_mul_i32(tcg_ctx,ret,ret,c2);
    ret_00 = tcg_ctx->cpu_gpr[rd];
    v1 = ret;
    goto LAB_0086ffa5;
  case 0x9a:
    c2 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
    v1 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,t,t);
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,t_00,t_00);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)c2,t,-0x80000000);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)v1,t_00,-1);
    tcg_gen_and_i64_mips64el(tcg_ctx,(TCGv_i64)c2,(TCGv_i64)c2,(TCGv_i64)v1);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)v1,t_00,0);
    tcg_gen_or_i64_mips64el(tcg_ctx,(TCGv_i64)c2,(TCGv_i64)c2,(TCGv_i64)v1);
    tcg_gen_movi_i64_mips64el(tcg_ctx,(TCGv_i64)v1,0);
    tcg_gen_movcond_i64_mips64el
              (tcg_ctx,TCG_COND_NE,t_00,(TCGv_i64)c2,(TCGv_i64)v1,(TCGv_i64)c2,t_00);
    tcg_gen_div_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],t,t_00);
    goto LAB_0086fed8;
  case 0x9b:
    c2 = (TCGv_i32)tcg_const_i64_mips64el(tcg_ctx,0);
    v1 = (TCGv_i32)tcg_const_i64_mips64el(tcg_ctx,1);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t_00,t_00);
    tcg_gen_movcond_i64_mips64el(tcg_ctx,TCG_COND_EQ,t_00,t_00,(TCGv_i64)c2,(TCGv_i64)v1,t_00);
    tcg_gen_divu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],t,t_00);
LAB_0086fed8:
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],tcg_ctx->cpu_gpr[rd]);
    break;
  case 0x9c:
  case 0x9d:
    tcg_gen_mul_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],t,t_00);
    goto LAB_0086ffc6;
  case 0x9e:
    c2 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
    v1 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)c2,t,-0x8000000000000000);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)v1,t_00,-1);
    tcg_gen_and_i64_mips64el(tcg_ctx,(TCGv_i64)c2,(TCGv_i64)c2,(TCGv_i64)v1);
    tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)v1,t_00,0);
    tcg_gen_or_i64_mips64el(tcg_ctx,(TCGv_i64)c2,(TCGv_i64)c2,(TCGv_i64)v1);
    tcg_gen_movi_i64_mips64el(tcg_ctx,(TCGv_i64)v1,0);
    tcg_gen_movcond_i64_mips64el
              (tcg_ctx,TCG_COND_NE,t_00,(TCGv_i64)c2,(TCGv_i64)v1,(TCGv_i64)c2,t_00);
    tcg_gen_div_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],t,t_00);
    break;
  case 0x9f:
    c2 = (TCGv_i32)tcg_const_i64_mips64el(tcg_ctx,0);
    v1 = (TCGv_i32)tcg_const_i64_mips64el(tcg_ctx,1);
    tcg_gen_movcond_i64_mips64el(tcg_ctx,TCG_COND_EQ,t_00,t_00,(TCGv_i64)c2,(TCGv_i64)v1,t_00);
    tcg_gen_divu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],t,t_00);
    break;
  default:
    switch(opc) {
    case 0xd8:
      v1 = tcg_temp_new_i32(tcg_ctx);
      ret = tcg_temp_new_i32(tcg_ctx);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,v1,t);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,ret,t_00);
      tcg_gen_muls2_i32_mips64el(tcg_ctx,v1,ret,v1,ret);
      goto LAB_0086ff92;
    case 0xd9:
      v1 = tcg_temp_new_i32(tcg_ctx);
      ret = tcg_temp_new_i32(tcg_ctx);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,v1,t);
      tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,ret,t_00);
      tcg_gen_mulu2_i32_mips64el(tcg_ctx,v1,ret,v1,ret);
LAB_0086ff92:
      ret_00 = tcg_ctx->cpu_gpr[rd];
      c2 = ret;
LAB_0086ffa5:
      tcg_gen_ext_i32_i64_mips64el(tcg_ctx,ret_00,ret);
      break;
    case 0xda:
      c2 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
      v1 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,t,t);
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,t_00,t_00);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)c2,t,-0x80000000);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)v1,t_00,-1);
      tcg_gen_and_i64_mips64el(tcg_ctx,(TCGv_i64)c2,(TCGv_i64)c2,(TCGv_i64)v1);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)v1,t_00,0);
      tcg_gen_or_i64_mips64el(tcg_ctx,(TCGv_i64)c2,(TCGv_i64)c2,(TCGv_i64)v1);
      tcg_gen_movi_i64_mips64el(tcg_ctx,(TCGv_i64)v1,0);
      tcg_gen_movcond_i64_mips64el
                (tcg_ctx,TCG_COND_NE,t_00,(TCGv_i64)c2,(TCGv_i64)v1,(TCGv_i64)c2,t_00);
      tcg_gen_rem_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],t,t_00);
      goto LAB_0086fed8;
    case 0xdb:
      c2 = (TCGv_i32)tcg_const_i64_mips64el(tcg_ctx,0);
      v1 = (TCGv_i32)tcg_const_i64_mips64el(tcg_ctx,1);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
      tcg_gen_ext32u_i64_mips64el(tcg_ctx,t_00,t_00);
      tcg_gen_movcond_i64_mips64el(tcg_ctx,TCG_COND_EQ,t_00,t_00,(TCGv_i64)c2,(TCGv_i64)v1,t_00);
      tcg_gen_remu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],t,t_00);
      goto LAB_0086fed8;
    case 0xdc:
      c2 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
      tcg_gen_muls2_i64_mips64el(tcg_ctx,(TCGv_i64)c2,tcg_ctx->cpu_gpr[rd],t,t_00);
      goto LAB_0086ffc1;
    case 0xdd:
      c2 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
      tcg_gen_mulu2_i64_mips64el(tcg_ctx,(TCGv_i64)c2,tcg_ctx->cpu_gpr[rd],t,t_00);
      goto LAB_0086ffc1;
    case 0xde:
      c2 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
      v1 = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)c2,t,-0x8000000000000000);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)v1,t_00,-1);
      tcg_gen_and_i64_mips64el(tcg_ctx,(TCGv_i64)c2,(TCGv_i64)c2,(TCGv_i64)v1);
      tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_EQ,(TCGv_i64)v1,t_00,0);
      tcg_gen_or_i64_mips64el(tcg_ctx,(TCGv_i64)c2,(TCGv_i64)c2,(TCGv_i64)v1);
      tcg_gen_movi_i64_mips64el(tcg_ctx,(TCGv_i64)v1,0);
      tcg_gen_movcond_i64_mips64el
                (tcg_ctx,TCG_COND_NE,t_00,(TCGv_i64)c2,(TCGv_i64)v1,(TCGv_i64)c2,t_00);
      tcg_gen_rem_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],t,t_00);
      break;
    case 0xdf:
      c2 = (TCGv_i32)tcg_const_i64_mips64el(tcg_ctx,0);
      v1 = (TCGv_i32)tcg_const_i64_mips64el(tcg_ctx,1);
      tcg_gen_movcond_i64_mips64el(tcg_ctx,TCG_COND_EQ,t_00,t_00,(TCGv_i64)c2,(TCGv_i64)v1,t_00);
      tcg_gen_remu_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],t,t_00);
      break;
    default:
      generate_exception_end(ctx,0x14);
      goto LAB_0086ffc6;
    }
  }
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(v1 + (long)tcg_ctx));
LAB_0086ffc1:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
LAB_0086ffc6:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_r6_muldiv(DisasContext *ctx, int opc, int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    switch (opc) {
    case R6_OPC_DIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, INT_MIN);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_MOD:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32s_tl(tcg_ctx, t1, t1);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, INT_MIN);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_MODU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_remu_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_MUL:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mul_i32(tcg_ctx, t2, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case R6_OPC_MUH:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_muls2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case R6_OPC_MULU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mul_i32(tcg_ctx, t2, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case R6_OPC_MUHU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mulu2_i32(tcg_ctx, t2, t3, t2, t3);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
#if defined(TARGET_MIPS64)
    case R6_OPC_DDIV:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, -1LL << 63);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1LL);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_div_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMOD:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv t3 = tcg_temp_new(tcg_ctx);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t2, t0, -1LL << 63);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, -1LL);
            tcg_gen_and_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, t3, t1, 0);
            tcg_gen_or_tl(tcg_ctx, t2, t2, t3);
            tcg_gen_movi_tl(tcg_ctx, t3, 0);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, t1, t2, t3, t2, t1);
            tcg_gen_rem_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DDIVU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_divu_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMODU:
        {
            TCGv t2 = tcg_const_tl(tcg_ctx, 0);
            TCGv t3 = tcg_const_tl(tcg_ctx, 1);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, t1, t1, t2, t3, t1);
            tcg_gen_remu_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t3);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMUL:
        tcg_gen_mul_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case R6_OPC_DMUH:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            tcg_gen_muls2_i64(tcg_ctx, t2, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
    case R6_OPC_DMULU:
        tcg_gen_mul_i64(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
        break;
    case R6_OPC_DMUHU:
        {
            TCGv t2 = tcg_temp_new(tcg_ctx);
            tcg_gen_mulu2_i64(tcg_ctx, t2, tcg_ctx->cpu_gpr[rd], t0, t1);
            tcg_temp_free(tcg_ctx, t2);
        }
        break;
#endif
    default:
        MIPS_INVAL("r6 mul/div");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
 out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}